

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::Reflection::AddField<std::__cxx11::string>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Message *in_RDX;
  Reflection *in_RSI;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *repeated;
  FieldDescriptor *in_stack_ffffffffffffffe0;
  
  MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  pbVar1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x432c66);
  return pbVar1;
}

Assistant:

Type* Reflection::AddField(Message* message,
                           const FieldDescriptor* field) const {
  RepeatedPtrField<Type>* repeated =
      MutableRaw<RepeatedPtrField<Type> >(message, field);
  return repeated->Add();
}